

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void __thiscall NULLCIO::WriteToConsole(NULLCIO *this,NULLCArray data)

{
  ulong uVar1;
  
  if (((uint)data.ptr != 0 && this != (NULLCIO *)0x0) && writeFunc != (code *)0x0) {
    uVar1 = (ulong)(uint)data.ptr;
    do {
      if (*this == (NULLCIO)0x0) {
        return;
      }
      (*writeFunc)(contextFunc,this,1);
      this = this + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void WriteToConsole(NULLCArray data)
	{
		if(!writeFunc)
			return;

		// Empty arrays are silently ignored
		if(!data.ptr)
			return;
		
		for(unsigned i = 0; i < data.len; i++)
		{
			if(!data.ptr[i])
				return;

			writeFunc(contextFunc, data.ptr + i, 1);
		}
	}